

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O3

IHEVCD_ERROR_T
ihevcd_short_term_ref_pic_set
          (bitstrm_t *ps_bitstrm,stref_picset_t *ps_stref_picset_base,
          WORD32 num_short_term_ref_pic_sets,WORD32 idx,stref_picset_t *ps_stref_picset)

{
  short sVar1;
  WORD16 WVar2;
  bool bVar3;
  WORD8 WVar4;
  UWORD32 UVar5;
  uint uVar6;
  UWORD32 UVar7;
  UWORD32 UVar8;
  ulong uVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  char cVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint local_3c;
  
  if (idx < 1) {
    ps_stref_picset->i1_inter_ref_pic_set_prediction_flag = '\0';
  }
  else {
    UVar5 = ihevcd_bits_get(ps_bitstrm,1);
    ps_stref_picset->i1_inter_ref_pic_set_prediction_flag = (char)UVar5;
    if ((char)UVar5 != '\0') {
      uVar6 = 0xffffffff;
      if (idx == num_short_term_ref_pic_sets) {
        UVar5 = ihevcd_uev(ps_bitstrm);
        uVar6 = ~UVar5;
      }
      uVar6 = uVar6 + idx;
      uVar14 = 0;
      if (0 < (int)uVar6) {
        uVar14 = uVar6;
      }
      if (idx <= (int)uVar6) {
        uVar14 = idx - 1;
      }
      UVar5 = ihevcd_bits_get(ps_bitstrm,1);
      UVar7 = ihevcd_uev(ps_bitstrm);
      cVar13 = ps_stref_picset_base[uVar14].i1_num_delta_pocs;
      local_3c = 0;
      uVar6 = 0;
      if (-1 < cVar13) {
        iVar15 = 0;
        uVar6 = 0;
        local_3c = 0;
        lVar20 = 0;
        do {
          UVar8 = ihevcd_bits_get(ps_bitstrm,1);
          ps_stref_picset->ai1_used[iVar15] = (WORD8)UVar8;
          if (UVar8 == 0) {
            UVar8 = ihevcd_bits_get(ps_bitstrm,1);
            UVar8 = UVar8 * 2;
          }
          if (UVar8 - 1 < 2) {
            iVar11 = 0;
            if (lVar20 < ps_stref_picset_base[uVar14].i1_num_delta_pocs) {
              iVar11 = (int)ps_stref_picset_base[uVar14].ai2_delta_poc[lVar20];
            }
            uVar12 = iVar11 + (UVar5 * -2 + 1) * (UVar7 + 1);
            ps_stref_picset->ai2_delta_poc[iVar15] = (WORD16)uVar12;
            local_3c = local_3c - ((int)uVar12 >> 0x1f);
            uVar6 = uVar6 - ((int)~uVar12 >> 0x1f);
            iVar15 = iVar15 + 1;
          }
          ps_stref_picset->ai1_ref_idc[lVar20] = (WORD8)UVar8;
          cVar13 = ps_stref_picset_base[uVar14].i1_num_delta_pocs;
          bVar3 = lVar20 < cVar13;
          lVar20 = lVar20 + 1;
        } while (bVar3);
      }
      uVar14 = 0;
      if (0 < (int)local_3c) {
        uVar14 = local_3c;
      }
      uVar9 = 0xf;
      if ((int)uVar14 < 0xf) {
        uVar9 = (ulong)uVar14;
      }
      uVar16 = (uint)uVar9 ^ 0xf;
      uVar12 = 0;
      if (0 < (int)uVar6) {
        uVar12 = uVar6;
      }
      if ((int)uVar16 < (int)uVar6) {
        uVar12 = uVar16;
      }
      uVar6 = (uint)uVar9 + uVar12;
      ps_stref_picset->i1_num_ref_idc = cVar13 + '\x01';
      ps_stref_picset->i1_num_delta_pocs = (WORD8)uVar6;
      ps_stref_picset->i1_num_pos_pics = (WORD8)uVar12;
      ps_stref_picset->i1_num_neg_pics = (WORD8)uVar9;
      if (1 < uVar6) {
        uVar17 = 1;
        uVar18 = 0;
        do {
          sVar1 = ps_stref_picset->ai2_delta_poc[uVar17];
          WVar4 = ps_stref_picset->ai1_used[uVar17];
          uVar19 = uVar18;
          do {
            uVar21 = uVar19 & 0xffffffff;
            if (sVar1 < ps_stref_picset->ai2_delta_poc[uVar21]) {
              ps_stref_picset->ai2_delta_poc[uVar19 + 1] = ps_stref_picset->ai2_delta_poc[uVar21];
              ps_stref_picset->ai1_used[uVar19 + 1] = ps_stref_picset->ai1_used[uVar21];
              ps_stref_picset->ai2_delta_poc[uVar21] = sVar1;
              ps_stref_picset->ai1_used[uVar21] = WVar4;
            }
            lVar20 = uVar19 + 1;
            uVar19 = uVar19 - 1;
          } while (1 < lVar20);
          uVar17 = uVar17 + 1;
          uVar18 = uVar18 + 1;
        } while (uVar17 != uVar6);
      }
      if ((int)local_3c < 2) {
        return 0;
      }
      uVar17 = 0xf;
      if (uVar14 < 0xf) {
        uVar17 = (ulong)uVar14;
      }
      uVar18 = 0;
      do {
        WVar2 = ps_stref_picset->ai2_delta_poc[uVar18];
        WVar4 = ps_stref_picset->ai1_used[uVar18];
        ps_stref_picset->ai2_delta_poc[uVar18] = ps_stref_picset->ai2_delta_poc[uVar17 - 1];
        ps_stref_picset->ai1_used[uVar18] = ps_stref_picset->ai1_used[uVar17 - 1];
        ps_stref_picset->ai2_delta_poc[uVar17 - 1] = WVar2;
        ps_stref_picset->ai1_used[uVar17 - 1] = WVar4;
        uVar17 = uVar17 - 1;
        uVar18 = uVar18 + 1;
      } while (uVar9 >> 1 != uVar18);
      return 0;
    }
  }
  UVar7 = ihevcd_uev(ps_bitstrm);
  UVar8 = 0;
  UVar5 = UVar7;
  if ((char)UVar7 < '\0') {
    UVar5 = UVar8;
  }
  WVar4 = (WORD8)UVar5;
  if ('\x0f' < (char)UVar7) {
    WVar4 = '\x0f';
  }
  ps_stref_picset->i1_num_neg_pics = WVar4;
  UVar5 = ihevcd_uev(ps_bitstrm);
  cVar10 = (char)UVar5;
  cVar13 = ps_stref_picset->i1_num_neg_pics;
  uVar9 = (ulong)(uint)(int)cVar13;
  iVar11 = 0xf - cVar13;
  iVar15 = 0;
  if ('\0' < cVar10) {
    iVar15 = (int)cVar10;
  }
  if (iVar11 < cVar10) {
    iVar15 = iVar11;
  }
  cVar10 = cVar13 + (char)iVar15;
  ps_stref_picset->i1_num_pos_pics = (char)iVar15;
  ps_stref_picset->i1_num_delta_pocs = cVar10;
  if ('\0' < cVar13) {
    lVar20 = 0;
    do {
      UVar5 = ihevcd_uev(ps_bitstrm);
      UVar8 = UVar8 + ~UVar5;
      ps_stref_picset->ai2_delta_poc[lVar20] = (WORD16)UVar8;
      UVar5 = ihevcd_bits_get(ps_bitstrm,1);
      ps_stref_picset->ai1_used[lVar20] = (WORD8)UVar5;
      lVar20 = lVar20 + 1;
      uVar9 = (ulong)ps_stref_picset->i1_num_neg_pics;
    } while (lVar20 < (long)uVar9);
    cVar10 = ps_stref_picset->i1_num_delta_pocs;
  }
  if ((int)uVar9 < (int)cVar10) {
    lVar20 = (long)(int)uVar9;
    iVar15 = 0;
    do {
      UVar5 = ihevcd_uev(ps_bitstrm);
      iVar15 = iVar15 + UVar5 + 1;
      ps_stref_picset->ai2_delta_poc[lVar20] = (WORD16)iVar15;
      UVar5 = ihevcd_bits_get(ps_bitstrm,1);
      ps_stref_picset->ai1_used[lVar20] = (WORD8)UVar5;
      lVar20 = lVar20 + 1;
    } while (lVar20 < ps_stref_picset->i1_num_delta_pocs);
  }
  return 0;
}

Assistant:

IHEVCD_ERROR_T ihevcd_short_term_ref_pic_set(bitstrm_t *ps_bitstrm,
                                             stref_picset_t *ps_stref_picset_base,
                                             WORD32 num_short_term_ref_pic_sets,
                                             WORD32 idx,
                                             stref_picset_t *ps_stref_picset)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 value;
    stref_picset_t *ps_stref_picset_ref;
    WORD32 delta_idx, delta_rps;
    WORD32 r_idx;
    WORD32 i;
    WORD32 j, k, temp;
    if(idx > 0)
    {
        BITS_PARSE("inter_ref_pic_set_prediction_flag", value, ps_bitstrm, 1);
        ps_stref_picset->i1_inter_ref_pic_set_prediction_flag = value;
    }
    else
        ps_stref_picset->i1_inter_ref_pic_set_prediction_flag = 0;

    if(ps_stref_picset->i1_inter_ref_pic_set_prediction_flag)
    {
        WORD32 delta_rps_sign;
        WORD32 abs_delta_rps;
        WORD32 num_neg_pics = 0;
        WORD32 num_pos_pics = 0;
        WORD32 num_pics = 0;

        if(idx == num_short_term_ref_pic_sets)
        {
            UEV_PARSE("delta_idx_minus1", value, ps_bitstrm);
            delta_idx = value + 1;
        }
        else
        {
            delta_idx = 1;
        }
        r_idx = idx - delta_idx;
        r_idx = CLIP3(r_idx, 0, idx - 1);

        ps_stref_picset_ref = ps_stref_picset_base + r_idx;

        BITS_PARSE("delta_rps_sign", value, ps_bitstrm, 1);
        delta_rps_sign = value;

        UEV_PARSE("abs_delta_rps_minus1", value, ps_bitstrm);
        abs_delta_rps = value + 1;

        delta_rps = (1 - 2 * delta_rps_sign) * (abs_delta_rps);



        for(i = 0; i <= ps_stref_picset_ref->i1_num_delta_pocs; i++)
        {
            WORD32 ref_idc;

            /*****************************************************************/
            /* ref_idc is parsed as below                                    */
            /* bits "1" ref_idc 1                                            */
            /* bits "01" ref_idc 2                                           */
            /* bits "00" ref_idc 0                                           */
            /*****************************************************************/
            BITS_PARSE("used_by_curr_pic_flag", value, ps_bitstrm, 1);
            ref_idc = value;
            ps_stref_picset->ai1_used[num_pics] = value;
            /* If ref_idc is zero check for next bit */
            if(0 == ref_idc)
            {
                BITS_PARSE("use_delta_flag", value, ps_bitstrm, 1);
                ref_idc = value << 1;
            }
            if((ref_idc == 1) || (ref_idc == 2))
            {
                WORD32 delta_poc;
                delta_poc = delta_rps;
                delta_poc +=
                                ((i < ps_stref_picset_ref->i1_num_delta_pocs) ?
                                ps_stref_picset_ref->ai2_delta_poc[i] :
                                0);

                ps_stref_picset->ai2_delta_poc[num_pics] = delta_poc;

                if(delta_poc < 0)
                {
                    num_neg_pics++;
                }
                else
                {
                    num_pos_pics++;
                }
                num_pics++;
            }
            ps_stref_picset->ai1_ref_idc[i] = ref_idc;
        }

        num_neg_pics = CLIP3(num_neg_pics, 0, MAX_DPB_SIZE - 1);
        num_pos_pics = CLIP3(num_pos_pics, 0, (MAX_DPB_SIZE - 1 - num_neg_pics));
        num_pics = num_neg_pics + num_pos_pics;

        ps_stref_picset->i1_num_ref_idc =
                        ps_stref_picset_ref->i1_num_delta_pocs + 1;
        ps_stref_picset->i1_num_delta_pocs = num_pics;
        ps_stref_picset->i1_num_pos_pics = num_pos_pics;
        ps_stref_picset->i1_num_neg_pics = num_neg_pics;


        for(j = 1; j < num_pics; j++)
        {
            WORD32 delta_poc = ps_stref_picset->ai2_delta_poc[j];
            WORD8 i1_used = ps_stref_picset->ai1_used[j];
            for(k = j - 1; k >= 0; k--)
            {
                temp = ps_stref_picset->ai2_delta_poc[k];
                if(delta_poc < temp)
                {
                    ps_stref_picset->ai2_delta_poc[k + 1] = temp;
                    ps_stref_picset->ai1_used[k + 1] = ps_stref_picset->ai1_used[k];
                    ps_stref_picset->ai2_delta_poc[k] = delta_poc;
                    ps_stref_picset->ai1_used[k] = i1_used;
                }
            }
        }
        // flip the negative values to largest first
        for(j = 0, k = num_neg_pics - 1; j < num_neg_pics >> 1; j++, k--)
        {
            WORD32 delta_poc = ps_stref_picset->ai2_delta_poc[j];
            WORD8 i1_used = ps_stref_picset->ai1_used[j];
            ps_stref_picset->ai2_delta_poc[j] = ps_stref_picset->ai2_delta_poc[k];
            ps_stref_picset->ai1_used[j] = ps_stref_picset->ai1_used[k];
            ps_stref_picset->ai2_delta_poc[k] = delta_poc;
            ps_stref_picset->ai1_used[k] = i1_used;
        }

    }
    else
    {
        WORD32 prev_poc = 0;
        WORD32 poc;

        UEV_PARSE("num_negative_pics", value, ps_bitstrm);
        ps_stref_picset->i1_num_neg_pics = value;
        ps_stref_picset->i1_num_neg_pics = CLIP3(ps_stref_picset->i1_num_neg_pics,
                                                 0,
                                                 MAX_DPB_SIZE - 1);

        UEV_PARSE("num_positive_pics", value, ps_bitstrm);
        ps_stref_picset->i1_num_pos_pics = value;
        ps_stref_picset->i1_num_pos_pics = CLIP3(ps_stref_picset->i1_num_pos_pics,
                                                 0,
                                                 (MAX_DPB_SIZE - 1 - ps_stref_picset->i1_num_neg_pics));

        ps_stref_picset->i1_num_delta_pocs =
                        ps_stref_picset->i1_num_neg_pics +
                        ps_stref_picset->i1_num_pos_pics;


        for(i = 0; i < ps_stref_picset->i1_num_neg_pics; i++)
        {
            UEV_PARSE("delta_poc_s0_minus1", value, ps_bitstrm);
            poc = prev_poc - (value + 1);
            prev_poc = poc;
            ps_stref_picset->ai2_delta_poc[i] = poc;

            BITS_PARSE("used_by_curr_pic_s0_flag", value, ps_bitstrm, 1);
            ps_stref_picset->ai1_used[i] = value;

        }
        prev_poc = 0;
        for(i = ps_stref_picset->i1_num_neg_pics;
                        i < ps_stref_picset->i1_num_delta_pocs;
                        i++)
        {
            UEV_PARSE("delta_poc_s1_minus1", value, ps_bitstrm);
            poc = prev_poc + (value + 1);
            prev_poc = poc;
            ps_stref_picset->ai2_delta_poc[i] = poc;

            BITS_PARSE("used_by_curr_pic_s1_flag", value, ps_bitstrm, 1);
            ps_stref_picset->ai1_used[i] = value;

        }

    }

    return ret;
}